

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConditionalPropertyExprSyntax *pCVar1;
  Token TVar2;
  Token *unaff_retaddr;
  BumpAllocator *in_stack_00000008;
  ElsePropertyClauseSyntax **in_stack_00000020;
  BumpAllocator *in_stack_000000d8;
  Token *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  ElsePropertyClauseSyntax *in_stack_ffffffffffffff90;
  
  TVar2 = parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x58e280);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  not_null<slang::syntax::PropertyExprSyntax_*>::operator*
            ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x58e2bd);
  deepClone<slang::syntax::PropertyExprSyntax>
            ((PropertyExprSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (((Token *)((long)__fn + 0x50))->info != (Info *)0x0) {
    deepClone<slang::syntax::ElsePropertyClauseSyntax>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConditionalPropertyExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::PropertyExprSyntax&,slang::syntax::ElsePropertyClauseSyntax*>
                     (in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (ExpressionSyntax *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,
                      in_stack_00000020);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConditionalPropertyExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConditionalPropertyExprSyntax>(
        node.ifKeyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.condition, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.expr, alloc),
        node.elseClause ? deepClone(*node.elseClause, alloc) : nullptr
    );
}